

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O0

void __thiscall xray_re::xr_scene_wallmarks::save(xr_scene_wallmarks *this,xr_writer *w)

{
  xr_scene_revision *this_00;
  xr_writer *w_local;
  xr_scene_wallmarks *this_local;
  
  this_00 = xr_scene_part::revision(&this->super_xr_scene_part);
  xr_scene_revision::save(this_00,w);
  xr_writer::w_chunk<unsigned_short>(w,1,&WALLMARK_VERSION);
  xr_writer::w_chunk<unsigned_int>(w,2,&this->m_flags);
  xr_writer::open_chunk(w,3);
  xr_writer::w_float(w,this->m_width);
  xr_writer::w_float(w,this->m_height);
  xr_writer::w_float(w,this->m_rotate);
  xr_writer::w_sz(w,&this->m_shader);
  xr_writer::w_sz(w,&this->m_texture);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,5);
  xr_writer::
  w_chunks<std::vector<xray_re::wm_slot_le*,std::allocator<xray_re::wm_slot_le*>>,write_slot>
            (w,&this->m_slots);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_scene_wallmarks::save(xr_writer& w) const
{
	revision().save(w);

	w.w_chunk<uint16_t>(WM_CHUNK_VERSION, WALLMARK_VERSION);
	w.w_chunk<uint32_t>(WM_CHUNK_FLAGS, m_flags);

	w.open_chunk(WM_CHUNK_PARAMS);
	w.w_float(m_width);
	w.w_float(m_height);
	w.w_float(m_rotate);
	w.w_sz(m_shader);
	w.w_sz(m_texture);
	w.close_chunk();

	w.open_chunk(WM_CHUNK_WALLMARKS_1);
	w.w_chunks(m_slots, write_slot());
	w.close_chunk();
}